

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_JUnitOutputTest_MultipleTestCasesInDifferentGroupsWithAssertions_TestShell::createTest
          (TEST_JUnitOutputTest_MultipleTestCasesInDifferentGroupsWithAssertions_TestShell *this)

{
  TEST_JUnitOutputTest_MultipleTestCasesInDifferentGroupsWithAssertions_Test *this_00;
  
  this_00 = (TEST_JUnitOutputTest_MultipleTestCasesInDifferentGroupsWithAssertions_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x2d2);
  TEST_JUnitOutputTest_MultipleTestCasesInDifferentGroupsWithAssertions_Test::
  TEST_JUnitOutputTest_MultipleTestCasesInDifferentGroupsWithAssertions_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, MultipleTestCasesInDifferentGroupsWithAssertions)
{
    testCaseRunner->start()
            .withGroup("groupOne")
            .withTest("testA").thatHasChecks(456)
            .endGroupAndClearTest()
            .withGroup("groupTwo")
            .withTest("testB").thatHasChecks(678)
            .end();

    outputFile = fileSystem.file("cpputest_groupOne.xml");
    STRCMP_EQUAL("<testcase classname=\"groupOne\" name=\"testA\" assertions=\"456\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));

    outputFile = fileSystem.file("cpputest_groupTwo.xml");
    STRCMP_EQUAL("<testcase classname=\"groupTwo\" name=\"testB\" assertions=\"678\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
}